

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimeparser.cpp
# Opt level: O1

int __thiscall QtMWidgets::Section::maxWidth(Section *this,QStyleOption *opt)

{
  Type TVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int i;
  int index;
  FormatType FVar5;
  QChar QVar6;
  int iVar7;
  QStyleOption *pQVar8;
  uint uVar9;
  QString t;
  QString local_a8;
  int local_8c;
  QStyleOption *local_88;
  QArrayData *local_80;
  char16_t *local_78;
  qsizetype qStack_70;
  ulong local_68;
  QArrayData *local_60 [3];
  QLocale local_48 [12];
  QTime local_3c;
  QDate local_38;
  
  QDate::QDate(&local_38,7999,0xc,0x1f);
  QTime::QTime(&local_3c,0x17,0x3b,0x3b,999);
  QDateTime::QDateTime((QDateTime *)&local_80,local_38,local_3c,LocalTime,0);
  value(&local_a8,this,(QDateTime *)&local_80);
  pQVar8 = opt + 0x20;
  iVar2 = QFontMetrics::boundingRect((QString *)pQVar8);
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,8);
    }
  }
  QDateTime::~QDateTime((QDateTime *)&local_80);
  iVar3 = QFontMetrics::averageCharWidth();
  uVar9 = (extraout_EDX - iVar2) + 1 + iVar3 / 3;
  local_68 = (ulong)uVar9;
  TVar1 = this->type;
  QVar6.ucs = (char16_t)&local_a8;
  FVar5 = (FormatType)&local_a8;
  local_88 = pQVar8;
  if ((int)TVar1 < 0x200) {
    if (TVar1 == DaySectionShort) {
      iVar2 = 0;
      iVar3 = 1;
      do {
        local_8c = iVar2;
        QLocale::system();
        QLocale::dayName((int)&local_80,(FormatType)local_48);
        local_a8.d.d = (Data *)local_80;
        local_a8.d.ptr = local_78;
        local_a8.d.size = qStack_70;
        if (local_80 != (QArrayData *)0x0) {
          LOCK();
          (local_80->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_80->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QString::append(QVar6);
        iVar2 = QFontMetrics::boundingRect((QString *)local_88);
        if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,8);
          }
        }
        if (local_80 != (QArrayData *)0x0) {
          LOCK();
          (local_80->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_80->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_80->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_80,2,8);
          }
        }
        iVar7 = (extraout_EDX_04 - iVar2) + 1;
        QLocale::~QLocale(local_48);
        iVar2 = local_8c;
        if (local_8c < iVar7) {
          iVar2 = iVar7;
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 != 8);
      QLocale::system();
      QLocale::dayName((int)local_60,FVar5);
      QLocale::~QLocale((QLocale *)&local_a8);
      iVar4 = QFontMetrics::boundingRect((QString *)local_88);
      iVar2 = (int)local_68;
      iVar7 = extraout_EDX_05;
    }
    else {
      if (TVar1 != DaySectionLong) {
        return uVar9;
      }
      iVar2 = 0;
      iVar3 = 1;
      do {
        local_8c = iVar2;
        QLocale::system();
        QLocale::dayName((int)&local_80,(FormatType)local_48);
        local_a8.d.d = (Data *)local_80;
        local_a8.d.ptr = local_78;
        local_a8.d.size = qStack_70;
        if (local_80 != (QArrayData *)0x0) {
          LOCK();
          (local_80->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_80->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QString::append(QVar6);
        iVar2 = QFontMetrics::boundingRect((QString *)local_88);
        if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,8);
          }
        }
        if (local_80 != (QArrayData *)0x0) {
          LOCK();
          (local_80->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_80->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_80->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_80,2,8);
          }
        }
        iVar7 = (extraout_EDX_00 - iVar2) + 1;
        QLocale::~QLocale(local_48);
        iVar2 = local_8c;
        if (local_8c < iVar7) {
          iVar2 = iVar7;
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 != 8);
      QLocale::system();
      QLocale::dayName((int)local_60,FVar5);
      QLocale::~QLocale((QLocale *)&local_a8);
      iVar4 = QFontMetrics::boundingRect((QString *)local_88);
      iVar2 = (int)local_68;
      iVar7 = extraout_EDX_01;
    }
    if (local_60[0] != (QArrayData *)0x0) {
      LOCK();
      (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_60[0],2,8);
      }
    }
    iVar3 = QFontMetrics::averageCharWidth();
    iVar3 = ((iVar2 + iVar7) - iVar4) + iVar3;
  }
  else {
    if (TVar1 == MonthSectionShort) {
      iVar2 = 0;
      iVar3 = 1;
      do {
        local_8c = iVar2;
        QLocale::system();
        QLocale::monthName((int)&local_80,(FormatType)local_48);
        local_a8.d.d = (Data *)local_80;
        local_a8.d.ptr = local_78;
        local_a8.d.size = qStack_70;
        if (local_80 != (QArrayData *)0x0) {
          LOCK();
          (local_80->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_80->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QString::append(QVar6);
        iVar2 = QFontMetrics::boundingRect((QString *)local_88);
        if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,8);
          }
        }
        if (local_80 != (QArrayData *)0x0) {
          LOCK();
          (local_80->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_80->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_80->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_80,2,8);
          }
        }
        iVar7 = (extraout_EDX_06 - iVar2) + 1;
        QLocale::~QLocale(local_48);
        iVar2 = local_8c;
        if (local_8c < iVar7) {
          iVar2 = iVar7;
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 != 0xd);
      QLocale::system();
      QLocale::monthName((int)local_60,FVar5);
      QLocale::~QLocale((QLocale *)&local_a8);
      iVar3 = QFontMetrics::boundingRect((QString *)local_88);
      iVar7 = (int)local_68;
      iVar2 = extraout_EDX_07;
    }
    else {
      if (TVar1 != MonthSectionLong) {
        return uVar9;
      }
      iVar2 = 0;
      iVar3 = 1;
      do {
        local_8c = iVar2;
        QLocale::system();
        QLocale::monthName((int)&local_80,(FormatType)local_48);
        local_a8.d.d = (Data *)local_80;
        local_a8.d.ptr = local_78;
        local_a8.d.size = qStack_70;
        if (local_80 != (QArrayData *)0x0) {
          LOCK();
          (local_80->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_80->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QString::append(QVar6);
        iVar2 = QFontMetrics::boundingRect((QString *)local_88);
        if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,8);
          }
        }
        if (local_80 != (QArrayData *)0x0) {
          LOCK();
          (local_80->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_80->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_80->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_80,2,8);
          }
        }
        iVar7 = (extraout_EDX_02 - iVar2) + 1;
        QLocale::~QLocale(local_48);
        iVar2 = local_8c;
        if (local_8c < iVar7) {
          iVar2 = iVar7;
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 != 0xd);
      QLocale::system();
      QLocale::monthName((int)local_60,FVar5);
      QLocale::~QLocale((QLocale *)&local_a8);
      iVar3 = QFontMetrics::boundingRect((QString *)local_88);
      iVar7 = (int)local_68;
      iVar2 = extraout_EDX_03;
    }
    iVar3 = (iVar7 + iVar2) - iVar3;
    if (local_60[0] != (QArrayData *)0x0) {
      LOCK();
      (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_60[0],2,8);
      }
    }
  }
  return iVar3 + 1;
}

Assistant:

int
Section::maxWidth( const QStyleOption & opt ) const
{
	int width = opt.fontMetrics.boundingRect( value(
		DATETIMEPICKER_DATETIME_MAX ) ).width();

	width += opt.fontMetrics.averageCharWidth() / 3;

	switch( type )
	{
		case DaySectionShort :
		{
			width += opt.fontMetrics.boundingRect( maxShortDay( opt ) ).width();
			width += opt.fontMetrics.averageCharWidth();
		}
		break;

		case DaySectionLong :
		{
			width += opt.fontMetrics.boundingRect( maxLongDay( opt ) ).width();
			width += opt.fontMetrics.averageCharWidth();
		}
		break;

		case MonthSectionShort :
			width += opt.fontMetrics.boundingRect( maxShortMonth( opt ) ).width();
		break;

		case MonthSectionLong :
			width += opt.fontMetrics.boundingRect( maxLongMonth( opt ) ).width();
		break;

		default:
			break;
	}

	return width;
}